

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O1

mchunkptr try_realloc_chunk(mstate m,mchunkptr p,size_t nb,int can_move)

{
  tbinptr pmVar1;
  char *pcVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  malloc_tree_chunk *pmVar6;
  malloc_tree_chunk *pmVar7;
  long lVar8;
  byte bVar9;
  mchunkptr p_00;
  char *pcVar10;
  ulong uVar11;
  malloc_tree_chunk **ppmVar12;
  uint uVar13;
  size_t psize;
  mchunkptr pmVar14;
  tbinptr pmVar15;
  size_t newsize;
  size_t __old_len;
  
  if (m < _gm_.least_addr) goto LAB_001057c4;
  uVar11 = m->dvsize;
  uVar13 = (uint)uVar11;
  if (((uVar13 & 3) == 1) || (pmVar14 = (mchunkptr)(uVar11 & 0xfffffffffffffff8), (long)pmVar14 < 1)
     ) goto LAB_001057c4;
  pmVar1 = (tbinptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&pmVar14[-3].bk)
  ;
  uVar5 = pmVar1->head;
  if ((uVar5 & 1) == 0) goto LAB_001057c4;
  if ((uVar11 & 3) == 0) {
    if (p < (mchunkptr)0x100) {
      return (mchunkptr)0x0;
    }
    if ((&p->head <= pmVar14) && ((ulong)((long)pmVar14 - (long)p) <= mparams.granularity * 2)) {
      return (mchunkptr)m;
    }
    lVar8 = *(long *)m;
    __old_len = (long)&pmVar14[1].prev_foot + lVar8;
    uVar11 = -mparams.page_size & (long)&p[1].bk + mparams.page_size + 6;
    pcVar10 = (char *)mremap((void *)((long)m - lVar8),__old_len,uVar11,(int)nb);
    if (pcVar10 == (char *)0xffffffffffffffff) {
      return (mchunkptr)0x0;
    }
    pmVar14 = (mchunkptr)(pcVar10 + lVar8);
    *(ulong *)(pcVar10 + lVar8 + 8) = (uVar11 - lVar8) + -0x20;
    pcVar2 = (char *)((uVar11 - lVar8) + -0x18 + (long)pmVar14);
    pcVar2[0] = '\v';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    pcVar2 = pcVar10 + (uVar11 - 0x10);
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    if (pcVar10 < _gm_.least_addr) {
      _gm_.least_addr = pcVar10;
    }
    _gm_.footprint = (uVar11 - __old_len) + _gm_.footprint;
    if (_gm_.max_footprint < _gm_.footprint) {
      _gm_.max_footprint = _gm_.footprint;
      return pmVar14;
    }
    return pmVar14;
  }
  p_00 = (mchunkptr)((long)pmVar14 - (long)p);
  if (p <= pmVar14) {
    if (p_00 < (mchunkptr)&DAT_00000020) {
      return (mchunkptr)m;
    }
    psize = (ulong)(uVar13 & 1) | (ulong)p | 2;
    m->dvsize = psize;
    *(ulong *)((long)&m->dvsize + (long)p) = (ulong)p_00 | 3;
    *(byte *)&pmVar1->head = (byte)pmVar1->head | 1;
    goto LAB_0010558c;
  }
  if (pmVar1 == (tbinptr)_gm_.top) {
    pmVar14 = (mchunkptr)((long)&pmVar14->prev_foot + _gm_.topsize);
    uVar11 = (long)pmVar14 - (long)p;
    if (pmVar14 < p || uVar11 == 0) {
      return (mchunkptr)0x0;
    }
    m->dvsize = (ulong)(uVar13 & 1) | (ulong)p | 2;
    *(ulong *)((long)&m->dvsize + (long)p) = uVar11 | 1;
    _gm_.topsize = uVar11;
    _gm_.top = (mchunkptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk)
    ;
    return (mchunkptr)m;
  }
  if (pmVar1 == (tbinptr)_gm_.dv) {
    pmVar14 = (mchunkptr)((long)&pmVar14->prev_foot + _gm_.dvsize);
    uVar11 = (long)pmVar14 - (long)p;
    if (pmVar14 < p) {
      return (mchunkptr)0x0;
    }
    if (uVar11 < 0x20) {
      m->dvsize = (ulong)(uVar13 & 1) | (ulong)pmVar14 | 2;
      pbVar3 = (byte *)((long)&m->dvsize + (long)pmVar14);
      *pbVar3 = *pbVar3 | 1;
      _gm_.dvsize = 0;
      _gm_.dv = (mchunkptr)0x0;
      return (mchunkptr)m;
    }
    m->dvsize = (ulong)(uVar13 & 1) | (ulong)p | 2;
    *(ulong *)((long)&m->dvsize + (long)p) = uVar11 | 1;
    *(ulong *)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&pmVar14[-3].bk) =
         uVar11;
    pbVar3 = (byte *)((long)&m->dvsize + (long)pmVar14);
    *pbVar3 = *pbVar3 & 0xfe;
    _gm_.dvsize = uVar11;
    _gm_.dv = (mchunkptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk);
    return (mchunkptr)m;
  }
  if ((uVar5 & 2) != 0) {
    return (mchunkptr)0x0;
  }
  pmVar14 = (mchunkptr)((long)&pmVar14->prev_foot + (uVar5 & 0xfffffffffffffff8));
  p_00 = (mchunkptr)((long)pmVar14 - (long)p);
  if (pmVar14 < p) {
    return (mchunkptr)0x0;
  }
  if (0xff < uVar5) {
    pmVar15 = pmVar1->bk;
    pmVar6 = pmVar1->parent;
    if (pmVar15 == pmVar1) {
      pmVar15 = pmVar1->child[1];
      if (pmVar15 != (tbinptr)0x0) {
        ppmVar12 = pmVar1->child + 1;
LAB_001056bc:
        do {
          if (pmVar15->child[1] == (malloc_tree_chunk *)0x0) {
            if (pmVar15->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x001056d0;
            ppmVar12 = pmVar15->child;
          }
          else {
            ppmVar12 = pmVar15->child + 1;
          }
          pmVar15 = *ppmVar12;
        } while( true );
      }
      pmVar15 = pmVar1->child[0];
      if (pmVar15 != (tbinptr)0x0) {
        ppmVar12 = pmVar1->child;
        goto LAB_001056bc;
      }
      pmVar15 = (tbinptr)0x0;
    }
    else {
      pmVar7 = pmVar1->fd;
      if (((pmVar7 < _gm_.least_addr) || (pmVar7->bk != pmVar1)) || (pmVar15->fd != pmVar1))
      goto LAB_001057c4;
      pmVar7->bk = pmVar15;
      pmVar15->fd = pmVar7;
    }
    goto LAB_001056e0;
  }
  pmVar6 = pmVar1->fd;
  pmVar7 = pmVar1->bk;
  if ((pmVar6 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar5 >> 3) * 2)) &&
     ((pmVar6 < _gm_.least_addr || (pmVar6->bk != pmVar1)))) goto LAB_001057c4;
  if (pmVar7 == pmVar6) {
    bVar9 = (byte)(uVar5 >> 3) & 0x1f;
    _gm_.smallmap = _gm_.smallmap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
  }
  else {
    if ((pmVar7 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar5 >> 3) * 2)) &&
       ((pmVar7 < _gm_.least_addr || (pmVar7->fd != pmVar1)))) goto LAB_001057c4;
    pmVar6->bk = pmVar7;
    pmVar7->fd = pmVar6;
  }
  goto LAB_0010577b;
code_r0x001056d0:
  if (ppmVar12 < _gm_.least_addr) goto LAB_001057c4;
  *ppmVar12 = (malloc_tree_chunk *)0x0;
LAB_001056e0:
  if (pmVar6 != (malloc_tree_chunk *)0x0) {
    uVar4 = pmVar1->index;
    if (pmVar1 == _gm_.treebins[uVar4]) {
      _gm_.treebins[uVar4] = pmVar15;
      if (pmVar15 == (tbinptr)0x0) {
        bVar9 = (byte)uVar4 & 0x1f;
        _gm_.treemap = _gm_.treemap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
        goto LAB_0010573a;
      }
    }
    else {
      if (pmVar6 < _gm_.least_addr) goto LAB_001057c4;
      if (pmVar6->child[0] == pmVar1) {
        pmVar6->child[0] = pmVar15;
      }
      else {
        pmVar6->child[1] = pmVar15;
      }
LAB_0010573a:
      if (pmVar15 == (tbinptr)0x0) goto LAB_0010577b;
    }
    pcVar10 = _gm_.least_addr;
    if (pmVar15 < _gm_.least_addr) {
LAB_001057c4:
      abort();
    }
    pmVar15->parent = pmVar6;
    pmVar6 = pmVar1->child[0];
    if (pmVar6 != (malloc_tree_chunk *)0x0) {
      if (pmVar6 < pcVar10) goto LAB_001057c4;
      pmVar15->child[0] = pmVar6;
      pmVar6->parent = pmVar15;
    }
    pmVar6 = pmVar1->child[1];
    if (pmVar6 != (malloc_tree_chunk *)0x0) {
      if (pmVar6 < pcVar10) goto LAB_001057c4;
      pmVar15->child[1] = pmVar6;
      pmVar6->parent = pmVar15;
    }
  }
LAB_0010577b:
  if (p_00 < (mchunkptr)&DAT_00000020) {
    m->dvsize = (long)&pmVar14->prev_foot + (ulong)(uVar13 & 1) + 2;
    pbVar3 = (byte *)((long)&m->dvsize + (long)pmVar14);
    *pbVar3 = *pbVar3 | 1;
    return (mchunkptr)m;
  }
  psize = (ulong)(uVar13 & 1) | (ulong)p | 2;
  m->dvsize = psize;
  *(ulong *)((long)&m->dvsize + (long)p) = (ulong)p_00 | 3;
  pbVar3 = (byte *)((long)&m->dvsize + (long)pmVar14);
  *pbVar3 = *pbVar3 | 1;
LAB_0010558c:
  dispose_chunk((mstate)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk),
                p_00,psize);
  return (mchunkptr)m;
}

Assistant:

static mchunkptr try_realloc_chunk(mstate m, mchunkptr p, size_t nb,
                                   int can_move) {
  mchunkptr newp = 0;
  size_t oldsize = chunksize(p);
  mchunkptr next = chunk_plus_offset(p, oldsize);
  if (RTCHECK(ok_address(m, p) && ok_inuse(p) &&
              ok_next(p, next) && ok_pinuse(next))) {
    if (is_mmapped(p)) {
      newp = mmap_resize(m, p, nb, can_move);
    }
    else if (oldsize >= nb) {             /* already big enough */
      size_t rsize = oldsize - nb;
      if (rsize >= MIN_CHUNK_SIZE) {      /* split off remainder */
        mchunkptr r = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        set_inuse(m, r, rsize);
        dispose_chunk(m, r, rsize);
      }
      newp = p;
    }
    else if (next == m->top) {  /* extend into top */
      if (oldsize + m->topsize > nb) {
        size_t newsize = oldsize + m->topsize;
        size_t newtopsize = newsize - nb;
        mchunkptr newtop = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        newtop->head = newtopsize |PINUSE_BIT;
        m->top = newtop;
        m->topsize = newtopsize;
        newp = p;
      }
    }
    else if (next == m->dv) { /* extend into dv */
      size_t dvs = m->dvsize;
      if (oldsize + dvs >= nb) {
        size_t dsize = oldsize + dvs - nb;
        if (dsize >= MIN_CHUNK_SIZE) {
          mchunkptr r = chunk_plus_offset(p, nb);
          mchunkptr n = chunk_plus_offset(r, dsize);
          set_inuse(m, p, nb);
          set_size_and_pinuse_of_free_chunk(r, dsize);
          clear_pinuse(n);
          m->dvsize = dsize;
          m->dv = r;
        }
        else { /* exhaust dv */
          size_t newsize = oldsize + dvs;
          set_inuse(m, p, newsize);
          m->dvsize = 0;
          m->dv = 0;
        }
        newp = p;
      }
    }
    else if (!cinuse(next)) { /* extend into next free chunk */
      size_t nextsize = chunksize(next);
      if (oldsize + nextsize >= nb) {
        size_t rsize = oldsize + nextsize - nb;
        unlink_chunk(m, next, nextsize);
        if (rsize < MIN_CHUNK_SIZE) {
          size_t newsize = oldsize + nextsize;
          set_inuse(m, p, newsize);
        }
        else {
          mchunkptr r = chunk_plus_offset(p, nb);
          set_inuse(m, p, nb);
          set_inuse(m, r, rsize);
          dispose_chunk(m, r, rsize);
        }
        newp = p;
      }
    }
  }
  else {
    USAGE_ERROR_ACTION(m, chunk2mem(p));
  }
  return newp;
}